

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O2

void __thiscall CFGTest_Empty_Test::~CFGTest_Empty_Test(CFGTest_Empty_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_F(CFGTest, Empty) {
  // Check that we create a correct CFG for an empty function.
  auto moduleText = R"wasm(
    (module (func $foo))
  )wasm";

  auto cfgText = R"cfg(;; preds: [], succs: []
;; entry
;; exit
0:
  0: block
)cfg";

  Module wasm;
  parseWast(wasm, moduleText);

  CFG cfg = CFG::fromFunction(wasm.getFunction("foo"));

  std::stringstream ss;
  cfg.print(ss);

  EXPECT_EQ(ss.str(), cfgText);
}